

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

bool __thiscall
QGraphicsScenePrivate::dispatchHoverEvent
          (QGraphicsScenePrivate *this,QGraphicsSceneHoverEvent *hoverEvent)

{
  QList<QGraphicsItem_*> *this_00;
  qsizetype *pqVar1;
  long lVar2;
  QGraphicsItem **ppQVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  QWidget *widget;
  QGraphicsScenePrivate *pQVar7;
  QGraphicsScenePrivate *pQVar8;
  QGraphicsItem *pQVar9;
  QGraphicsItem *pQVar10;
  iterator iVar11;
  QGraphicsScenePrivate *pQVar12;
  QGraphicsScenePrivate *item;
  int iVar13;
  long unaff_RBP;
  long lVar14;
  long lVar15;
  int iVar16;
  long in_FS_OFFSET;
  QPointF QVar17;
  QPointF local_70;
  QPoint local_60;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0xb9 & 0x10) != 0) {
    bVar5 = false;
    goto LAB_00614b7e;
  }
  pQVar12 = this;
  if ((this->cachedItemsUnderMouse).d.size == 0) {
    pQVar12 = (QGraphicsScenePrivate *)&this->cachedItemsUnderMouse;
    local_60 = QGraphicsSceneHoverEvent::screenPos(hoverEvent);
    QVar17 = QGraphicsSceneHoverEvent::scenePos(hoverEvent);
    local_70.yp = QVar17.yp;
    local_70.xp = QVar17.xp;
    widget = QGraphicsSceneEvent::widget(&hoverEvent->super_QGraphicsSceneEvent);
    itemsAtPosition((QList<QGraphicsItem_*> *)&local_58,this,&local_60,&local_70,widget);
    QArrayDataPointer<QGraphicsItem_*>::operator=
              ((QArrayDataPointer<QGraphicsItem_*> *)pQVar12,&local_58);
    if ((QGraphicsScenePrivate *)local_58.d != (QGraphicsScenePrivate *)0x0) {
      LOCK();
      *(int *)local_58.d = *(int *)local_58.d + -1;
      UNLOCK();
      if (*(int *)local_58.d == 0) {
        QArrayData::deallocate(&(local_58.d)->super_QArrayData,8,0x10);
        pQVar12 = (QGraphicsScenePrivate *)local_58.d;
      }
    }
  }
  lVar14 = (this->cachedItemsUnderMouse).d.size;
  if (lVar14 == 0) {
    item = (QGraphicsScenePrivate *)0x0;
  }
  else {
    ppQVar3 = (this->cachedItemsUnderMouse).d.ptr;
    lVar15 = 0;
    do {
      item = *(QGraphicsScenePrivate **)((long)ppQVar3 + lVar15);
      bVar5 = itemAcceptsHoverEvents_helper(pQVar12,(QGraphicsItem *)item);
      if (bVar5) break;
      bVar5 = lVar14 * 8 + -8 != lVar15;
      item = (QGraphicsScenePrivate *)0x0;
      lVar15 = lVar15 + 8;
    } while (bVar5);
  }
  if (item == (QGraphicsScenePrivate *)0x0) {
    pQVar7 = (QGraphicsScenePrivate *)0x0;
  }
  else {
    lVar14 = (this->hoverItems).d.size;
    if (lVar14 == 0) {
      pQVar7 = (QGraphicsScenePrivate *)0x0;
    }
    else {
      pQVar12 = item;
      pQVar7 = (QGraphicsScenePrivate *)
               QGraphicsItem::commonAncestorItem
                         ((QGraphicsItem *)item,(this->hoverItems).d.ptr[lVar14 + -1]);
    }
  }
  while( true ) {
    bVar5 = pQVar7 == (QGraphicsScenePrivate *)0x0;
    unaff_RBP = CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar5);
    if (bVar5) break;
    bVar6 = itemAcceptsHoverEvents_helper(pQVar12,(QGraphicsItem *)pQVar7);
    if (bVar6) {
      if (!bVar5) {
        pQVar9 = QGraphicsItem::panel((QGraphicsItem *)pQVar7);
        pQVar10 = QGraphicsItem::panel((QGraphicsItem *)item);
        if (pQVar9 != pQVar10) {
          pQVar7 = (QGraphicsScenePrivate *)0x0;
        }
      }
      break;
    }
    pQVar8 = (QGraphicsScenePrivate *)QGraphicsItem::parentItem((QGraphicsItem *)pQVar7);
    pQVar12 = pQVar7;
    pQVar7 = pQVar8;
  }
  if (pQVar7 == (QGraphicsScenePrivate *)0x0) {
    iVar13 = -1;
  }
  else {
    lVar14 = (this->hoverItems).d.size;
    if (lVar14 != 0) {
      lVar15 = -8;
      do {
        iVar13 = (int)unaff_RBP;
        lVar2 = lVar14 * -8 + lVar15;
        if (lVar2 == -8) goto LAB_006149fe;
        unaff_RBP = lVar15 + 8;
        lVar4 = lVar15 + 8;
        lVar15 = unaff_RBP;
      } while (*(QGraphicsScenePrivate **)((long)(this->hoverItems).d.ptr + lVar4) != pQVar7);
      iVar13 = (int)(unaff_RBP >> 3);
LAB_006149fe:
      if (lVar2 != -8) goto LAB_00614a12;
    }
    iVar13 = -1;
  }
LAB_00614a12:
  this_00 = &this->hoverItems;
  iVar16 = (int)(this->hoverItems).d.size;
  while (iVar16 = iVar16 + -1, iVar13 < iVar16) {
    pQVar12 = (QGraphicsScenePrivate *)this_00;
    iVar11 = QList<QGraphicsItem_*>::end(this_00);
    pQVar9 = iVar11.i[-1];
    pqVar1 = &(this->hoverItems).d.size;
    *pqVar1 = *pqVar1 + -1;
    bVar5 = itemAcceptsHoverEvents_helper(pQVar12,pQVar9);
    if (bVar5) {
      sendHoverEvent(this,GraphicsSceneHoverLeave,pQVar9,hoverEvent);
    }
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (QGraphicsItem **)0x0;
  local_58.size = 0;
  if ((item != (QGraphicsScenePrivate *)0x0) && (item != pQVar7)) {
    pQVar12 = item;
    do {
      local_70.xp = (qreal)pQVar12;
      QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                ((QPodArrayOps<QGraphicsItem*> *)&local_58,local_58.size,(QGraphicsItem **)&local_70
                );
      QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)&local_58);
      bVar5 = QGraphicsItem::isPanel((QGraphicsItem *)pQVar12);
      if ((bVar5) ||
         (pQVar12 = (QGraphicsScenePrivate *)QGraphicsItem::parentItem((QGraphicsItem *)pQVar12),
         pQVar12 == (QGraphicsScenePrivate *)0x0)) break;
    } while (pQVar12 != pQVar7);
  }
  ppQVar3 = local_58.ptr;
  if (local_58.size != 0) {
    lVar14 = local_58.size << 3;
    do {
      pQVar12 = *(QGraphicsScenePrivate **)((long)ppQVar3 + lVar14 + -8);
      local_70.xp = (qreal)pQVar12;
      QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                ((QPodArrayOps<QGraphicsItem*> *)this_00,(this->hoverItems).d.size,
                 (QGraphicsItem **)&local_70);
      pQVar7 = (QGraphicsScenePrivate *)this_00;
      QList<QGraphicsItem_*>::end(this_00);
      bVar5 = itemAcceptsHoverEvents_helper(pQVar7,(QGraphicsItem *)pQVar12);
      if (bVar5) {
        sendHoverEvent(this,GraphicsSceneHoverEnter,(QGraphicsItem *)pQVar12,hoverEvent);
      }
      lVar14 = lVar14 + -8;
    } while (lVar14 != 0);
  }
  if (((item == (QGraphicsScenePrivate *)0x0) || (lVar14 = (this->hoverItems).d.size, lVar14 == 0))
     || (item != (QGraphicsScenePrivate *)(this->hoverItems).d.ptr[lVar14 + -1])) {
    bVar5 = false;
  }
  else {
    sendHoverEvent(this,GraphicsSceneHoverMove,(QGraphicsItem *)item,hoverEvent);
    bVar5 = true;
  }
  if ((QGraphicsScenePrivate *)local_58.d != (QGraphicsScenePrivate *)0x0) {
    LOCK();
    *(int *)local_58.d = *(int *)local_58.d + -1;
    UNLOCK();
    if (*(int *)local_58.d == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,8,0x10);
    }
  }
LAB_00614b7e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsScenePrivate::dispatchHoverEvent(QGraphicsSceneHoverEvent *hoverEvent)
{
    if (allItemsIgnoreHoverEvents)
        return false;

    // Find the first item that accepts hover events, reusing earlier
    // calculated data is possible.
    if (cachedItemsUnderMouse.isEmpty()) {
        cachedItemsUnderMouse = itemsAtPosition(hoverEvent->screenPos(),
                                                hoverEvent->scenePos(),
                                                hoverEvent->widget());
    }

    QGraphicsItem *item = nullptr;
    for (auto tmp : std::as_const(cachedItemsUnderMouse)) {
        if (itemAcceptsHoverEvents_helper(tmp)) {
            item = tmp;
            break;
        }
    }

    // Find the common ancestor item for the new topmost hoverItem and the
    // last item in the hoverItem list.
    QGraphicsItem *commonAncestorItem = (item && !hoverItems.isEmpty()) ? item->commonAncestorItem(hoverItems.constLast()) : nullptr;
    while (commonAncestorItem && !itemAcceptsHoverEvents_helper(commonAncestorItem))
        commonAncestorItem = commonAncestorItem->parentItem();
    if (commonAncestorItem && commonAncestorItem->panel() != item->panel()) {
        // The common ancestor isn't in the same panel as the two hovered
        // items.
        commonAncestorItem = nullptr;
    }

    // Check if the common ancestor item is known.
    int index = commonAncestorItem ? hoverItems.indexOf(commonAncestorItem) : -1;
    // Send hover leaves to any existing hovered children of the common
    // ancestor item.
    for (int i = hoverItems.size() - 1; i > index; --i) {
        QGraphicsItem *lastItem = hoverItems.takeLast();
        if (itemAcceptsHoverEvents_helper(lastItem))
            sendHoverEvent(QEvent::GraphicsSceneHoverLeave, lastItem, hoverEvent);
    }

    // Item is a child of a known item. Generate enter events for the
    // missing links.
    QList<QGraphicsItem *> parents;
    QGraphicsItem *parent = item;
    while (parent && parent != commonAncestorItem) {
        parents.append(parent);
        if (parent->isPanel()) {
            // Stop at the panel - we don't deliver beyond this point.
            break;
        }
        parent = parent->parentItem();
    }
    for (auto it = parents.crbegin(), end = parents.crend(); it != end; ++it) {
        QGraphicsItem *parent = *it;
        hoverItems << parent;
        if (itemAcceptsHoverEvents_helper(parent))
            sendHoverEvent(QEvent::GraphicsSceneHoverEnter, parent, hoverEvent);
    }

    // Generate a move event for the item itself
    if (item
        && !hoverItems.isEmpty()
        && item == hoverItems.constLast()) {
        sendHoverEvent(QEvent::GraphicsSceneHoverMove, item, hoverEvent);
        return true;
    }
    return false;
}